

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  istream *piVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  vector<bool,_std::allocator<bool>_> local_c0;
  int local_98;
  int local_94;
  int nbFloors;
  int width;
  int nbRounds;
  int exitFloor;
  int nbTotalClones;
  int nbAdditionalElevators;
  elevators_t e;
  int elevatorFloor;
  undefined1 local_58;
  undefined7 uStack_57;
  int local_44;
  int local_40;
  int exitPos;
  int nbElevators;
  uint local_34;
  int clonePos;
  int elevatorPos;
  
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_98);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&local_94);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&nbFloors);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&width);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&local_44);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&nbRounds);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&exitFloor);
  std::istream::operator>>(piVar2,&local_40);
  std::istream::ignore();
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&nbTotalClones,(long)local_40 + 1,
             (allocator_type *)&local_c0);
  e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)((ulong)e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_c0,(long)local_40,
             (bool *)&e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(allocator_type *)&local_34);
  if (0 < local_40) {
    iVar7 = 0;
    do {
      piVar2 = (istream *)
               std::istream::operator>>
                         ((istream *)&std::cin,
                          (int *)&e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
      std::istream::operator>>(piVar2,(int *)&local_34);
      std::istream::ignore();
      _nbTotalClones
      [(int)e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage] = local_34;
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_40);
  }
  _nbTotalClones[local_40] = local_44;
  exitPos = -1;
  bVar8 = true;
  do {
    local_58 = 0;
    e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&local_58;
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_34);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&nbElevators);
    std::operator>>(piVar2,(string *)
                           &e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    std::istream::ignore();
    uVar5 = (ulong)(int)local_34;
    if (uVar5 == 0xffffffffffffffff) {
LAB_001024a8:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WAIT",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
    }
    else {
      uVar1 = local_34 + 0x3f;
      if (-1 < (int)local_34) {
        uVar1 = local_34;
      }
      if ((local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)((int)uVar1 >> 6) +
            ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)] >> (uVar5 & 0x3f) & 1)
          != 0) goto LAB_001024a8;
      if (bVar8) {
        exitPos = nbElevators;
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      iVar7 = _nbTotalClones[(int)local_34];
      if (nbElevators < iVar7) {
        iVar7 = std::__cxx11::string::compare
                          ((char *)&e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
        if (iVar7 != 0) {
          iVar7 = _nbTotalClones[(int)local_34];
          goto LAB_0010258a;
        }
LAB_001025d1:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WAIT",4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        uVar1 = local_34 + 0x3f;
        if (-1 < (long)(int)local_34) {
          uVar1 = local_34;
        }
        local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [(long)((int)uVar1 >> 6) +
         ((ulong)(((long)(int)local_34 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
             local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)((int)uVar1 >> 6) +
              ((ulong)(((long)(int)local_34 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
             1L << ((byte)local_34 & 0x3f);
      }
      else {
LAB_0010258a:
        if ((iVar7 < nbElevators) &&
           (iVar7 = std::__cxx11::string::compare
                              ((char *)&e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage), iVar7 == 0))
        goto LAB_001025d1;
        if ((int)local_34 < 1) {
          if (local_34 == 0) {
            lVar4 = 5;
            pcVar6 = "BLOCK";
            if (nbElevators != exitPos) goto LAB_00102674;
          }
LAB_00102668:
          lVar4 = 4;
          pcVar6 = "WAIT";
        }
        else {
          lVar4 = 5;
          pcVar6 = "BLOCK";
          if (nbElevators == _nbTotalClones[(ulong)local_34 - 1]) goto LAB_00102668;
        }
LAB_00102674:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
      bVar8 = false;
    }
    if (e.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)&local_58) {
      operator_delete(e.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,CONCAT71(uStack_57,local_58) + 1);
    }
  } while( true );
}

Assistant:

int main()
{
    int nbFloors; // number of floors
    int width; // width of the area
    int nbRounds; // maximum number of rounds
    int exitFloor; // floor on which the exit is found
    int exitPos; // position of the exit on its floor
    int nbTotalClones; // number of generated clones
    int nbAdditionalElevators; // ignore (always zero)
    int nbElevators; // number of elevators
    cin >> nbFloors >> width >> nbRounds >> exitFloor >> exitPos >> nbTotalClones >> nbAdditionalElevators >> nbElevators; cin.ignore();
    
    typedef std::pair<int, int> pair_t;
    typedef std::vector<int> elevators_t;
    typedef std::vector<bool> fixed_t;
    
    elevators_t e(nbElevators + 1);
    fixed_t f(nbElevators, false);
    for (int i = 0; i < nbElevators; i++)
    {
        int elevatorFloor; // floor on which this elevator is found
        int elevatorPos; // position of the elevator on its floor
        cin >> elevatorFloor >> elevatorPos;
        cin.ignore();
        e[elevatorFloor] = elevatorPos;
    }
    e[nbElevators] = exitPos;
    
    bool first = true;
    int start = -1;
    while (1)
    {
        int cloneFloor; // floor of the leading clone
        int clonePos; // position of the leading clone on its floor
        string direction; // direction of the leading clone: LEFT or RIGHT
        cin >> cloneFloor >> clonePos >> direction; cin.ignore();

        if (-1 == cloneFloor || f[cloneFloor])
        {
            cout << "WAIT" << endl;
            continue;
        }
        if (first)
        {
            start = clonePos;
            first = false;
        }
        
        cerr << cloneFloor << "/" << e.size() << endl;
        if ((clonePos < e[cloneFloor] && direction == "RIGHT")
            || (clonePos > e[cloneFloor] && direction == "LEFT"))
        {
            cout << "WAIT" << endl;
            f[cloneFloor] = true;
        } else
        {
            if ((0 < cloneFloor && clonePos != e[cloneFloor - 1])
                || (0 == cloneFloor && clonePos != start))
            {
                cout << "BLOCK" << endl;
            }
            else
            {
                cout << "WAIT" << endl;
            }
        }
    }
}